

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O3

void __thiscall
proto2_unittest::TestExtensionRangeSerialize::Clear(TestExtensionRangeSerialize *this)

{
  google::protobuf::internal::ExtensionSet::Clear(&(this->field_0)._impl_._extensions_);
  if ((*(byte *)((long)&this->field_0 + 0x18) & 0xf) != 0) {
    *(undefined8 *)((long)&this->field_0 + 0x20) = 0;
    *(undefined8 *)((long)&this->field_0 + 0x28) = 0;
  }
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestExtensionRangeSerialize::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.TestExtensionRangeSerialize)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_._extensions_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000000fu) != 0) {
    ::memset(&_impl_.foo_one_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.foo_four_) -
        reinterpret_cast<char*>(&_impl_.foo_one_)) + sizeof(_impl_.foo_four_));
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}